

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::GridWavelet::GridWavelet
          (GridWavelet *this,AccelerationContext *acc,MultiIndexSet *pset,int cnum_outputs,
          int corder,Data2D<double> *vals)

{
  int iVar1;
  MultiIndexSet *cpoints;
  int cnum_values;
  size_t sVar2;
  vector<double,_std::allocator<double>_> local_d0;
  StorageSet local_b8;
  StorageSet local_80;
  MultiIndexSet local_58;
  Data2D<double> *local_30;
  Data2D<double> *vals_local;
  int corder_local;
  int cnum_outputs_local;
  MultiIndexSet *pset_local;
  AccelerationContext *acc_local;
  GridWavelet *this_local;
  
  local_30 = vals;
  vals_local._0_4_ = corder;
  vals_local._4_4_ = cnum_outputs;
  _corder_local = pset;
  pset_local = (MultiIndexSet *)acc;
  acc_local = (AccelerationContext *)this;
  sVar2 = MultiIndexSet::getNumDimensions(pset);
  cpoints = _corder_local;
  iVar1 = vals_local._4_4_;
  MultiIndexSet::MultiIndexSet(&local_58);
  StorageSet::StorageSet(&local_80);
  BaseCanonicalGrid::BaseCanonicalGrid
            (&this->super_BaseCanonicalGrid,acc,(int)sVar2,iVar1,cpoints,&local_58,&local_80);
  StorageSet::~StorageSet(&local_80);
  MultiIndexSet::~MultiIndexSet(&local_58);
  (this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid = (_func_int **)&PTR__GridWavelet_00351460
  ;
  RuleWavelet::RuleWavelet(&this->rule1D,(int)vals_local,10);
  this->order = (int)vals_local;
  Data2D<double>::Data2D(&this->coefficients);
  TasSparse::WaveletBasisMatrix::WaveletBasisMatrix(&this->inter_matrix);
  ::std::unique_ptr<TasGrid::SimpleConstructData,std::default_delete<TasGrid::SimpleConstructData>>
  ::unique_ptr<std::default_delete<TasGrid::SimpleConstructData>,void>
            ((unique_ptr<TasGrid::SimpleConstructData,std::default_delete<TasGrid::SimpleConstructData>>
              *)&this->dynamic_values);
  ::std::
  unique_ptr<TasGrid::CudaWaveletData<double>,std::default_delete<TasGrid::CudaWaveletData<double>>>
  ::unique_ptr<std::default_delete<TasGrid::CudaWaveletData<double>>,void>
            ((unique_ptr<TasGrid::CudaWaveletData<double>,std::default_delete<TasGrid::CudaWaveletData<double>>>
              *)&this->gpu_cache);
  ::std::
  unique_ptr<TasGrid::CudaWaveletData<float>,std::default_delete<TasGrid::CudaWaveletData<float>>>::
  unique_ptr<std::default_delete<TasGrid::CudaWaveletData<float>>,void>
            ((unique_ptr<TasGrid::CudaWaveletData<float>,std::default_delete<TasGrid::CudaWaveletData<float>>>
              *)&this->gpu_cachef);
  if (0 < (this->super_BaseCanonicalGrid).num_outputs) {
    iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    cnum_values = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
    Data2D<double>::release(&local_d0,local_30);
    StorageSet::StorageSet(&local_b8,iVar1,cnum_values,&local_d0);
    StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,&local_b8);
    StorageSet::~StorageSet(&local_b8);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_d0);
    recomputeCoefficients(this);
  }
  return;
}

Assistant:

GridWavelet::GridWavelet(AccelerationContext const *acc, MultiIndexSet &&pset, int cnum_outputs, int corder, Data2D<double> &&vals) :
    BaseCanonicalGrid(acc, static_cast<int>(pset.getNumDimensions()), cnum_outputs, std::forward<MultiIndexSet>(pset),
                      MultiIndexSet(), StorageSet()),
    rule1D(corder, 10),
    order(corder)
{
    if (num_outputs > 0){
        values = StorageSet(num_outputs, points.getNumIndexes(), vals.release());
        recomputeCoefficients();
    }
}